

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O1

void ncnn::im2col_sgemm_pack8to1_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  uint _h;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  void *pvVar11;
  void *pvVar12;
  int nn_2;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  undefined4 *puVar16;
  undefined8 *puVar17;
  int *piVar18;
  ulong uVar19;
  int *piVar20;
  int nn;
  undefined4 *puVar21;
  undefined8 *puVar22;
  int iVar23;
  int *piVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  int *piVar29;
  undefined1 (*pauVar30) [16];
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  char cVar44;
  char cVar45;
  int iVar35;
  char cVar46;
  char cVar47;
  char cVar49;
  char cVar50;
  int iVar48;
  int iVar51;
  int iVar52;
  undefined1 auVar36 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar62 [16];
  int iVar70;
  int iVar87;
  int iVar88;
  int iVar89;
  undefined1 auVar71 [16];
  undefined1 auVar79 [16];
  undefined1 auVar90 [16];
  int iVar91;
  int iVar93;
  int iVar94;
  int iVar95;
  undefined1 auVar92 [16];
  int iVar96;
  int iVar106;
  int iVar107;
  int iVar108;
  undefined1 auVar97 [16];
  undefined1 auVar105 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar130 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  int nn_1;
  Mat local_c8;
  Mat *local_78;
  Mat *local_70;
  long local_68;
  ulong local_60;
  void *local_58;
  void *local_50;
  ulong local_48;
  void *local_40;
  long local_38;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  
  iVar8 = cpu_support_x86_xop();
  if (iVar8 == 0) {
    uVar1 = bottom_im2col->w;
    uVar13 = (ulong)(int)uVar1;
    iVar8 = bottom_im2col->h;
    _h = bottom_im2col->c;
    iVar2 = top_blob->c;
    local_c8.cstep = 0;
    local_c8.elemsize = 0;
    local_c8.elempack = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    uVar15 = (uVar1 & 1) + (uVar1 >> 1);
    if ((long)uVar13 < 2) {
      uVar15 = uVar1;
    }
    local_70 = top_blob;
    Mat::create(&local_c8,iVar8 << (1 < (long)uVar13),_h,uVar15,8,8,opt->workspace_allocator);
    if (0 < (int)uVar1 >> 1) {
      lVar10 = 0;
      uVar14 = 0;
      do {
        if (0 < (int)_h) {
          puVar16 = (undefined4 *)
                    (local_c8.cstep * uVar14 * local_c8.elemsize + (long)local_c8.data);
          uVar19 = 0;
          do {
            if (0 < iVar8) {
              puVar21 = (undefined4 *)
                        ((long)bottom_im2col->data +
                        bottom_im2col->cstep * bottom_im2col->elemsize * uVar19 + lVar10);
              iVar23 = iVar8;
              do {
                uVar5 = puVar21[1];
                uVar6 = puVar21[2];
                uVar7 = puVar21[3];
                *puVar16 = *puVar21;
                puVar16[1] = uVar5;
                puVar16[2] = uVar6;
                puVar16[3] = uVar7;
                puVar16 = puVar16 + 4;
                puVar21 = puVar21 + uVar13 * 2;
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != _h);
        }
        uVar14 = uVar14 + 1;
        lVar10 = lVar10 + 0x10;
      } while (uVar14 != (uint)((int)uVar1 >> 1));
    }
    uVar14 = uVar13 & 0xfffffffffffffffe;
    if ((uint)uVar14 != uVar1) {
      pvVar11 = (void *)(uVar14 * 8 + (long)bottom_im2col->data);
      do {
        if (0 < (int)_h) {
          uVar15 = ((uint)(uVar14 >> 0x1f) & 1) + (int)uVar14;
          puVar17 = (undefined8 *)
                    ((long)(int)(((int)uVar15 >> 1) + ((int)uVar14 - (uVar15 & 0xfffffffe))) *
                     local_c8.cstep * local_c8.elemsize + (long)local_c8.data);
          uVar19 = 0;
          do {
            if (0 < iVar8) {
              puVar22 = (undefined8 *)
                        (bottom_im2col->cstep * bottom_im2col->elemsize * uVar19 + (long)pvVar11);
              iVar23 = iVar8;
              do {
                *puVar17 = *puVar22;
                puVar17 = puVar17 + 1;
                puVar22 = puVar22 + uVar13;
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != _h);
        }
        uVar14 = uVar14 + 1;
        pvVar11 = (void *)((long)pvVar11 + 8);
      } while ((long)uVar14 < (long)uVar13);
    }
    if (0 < iVar2 >> 2) {
      local_38 = local_70->cstep * local_70->elemsize;
      local_40 = local_70->data;
      local_58 = local_c8.data;
      local_50 = kernel->data;
      local_68 = kernel->cstep * kernel->elemsize;
      iVar23 = _h * iVar8;
      local_48 = (ulong)(uint)(iVar2 >> 2);
      uVar14 = 0;
      pvVar11 = local_50;
      do {
        local_60 = uVar14;
        piVar29 = (int *)(local_60 * 4 * local_38 + (long)local_40);
        piVar18 = (int *)((local_60 * 4 + 1) * local_38 + (long)local_40);
        piVar24 = (int *)((local_60 * 4 + 2) * local_38 + (long)local_40);
        piVar20 = (int *)((local_60 * 4 + 3) * local_38 + (long)local_40);
        if ((int)uVar1 < 2) {
          uVar14 = 0;
        }
        else {
          uVar19 = 0;
          pvVar12 = local_c8.data;
          do {
            if (iVar23 < 1) {
              iVar70 = 0;
              iVar87 = 0;
              iVar88 = 0;
              iVar89 = 0;
              auVar139 = (undefined1  [16])0x0;
              auVar120 = (undefined1  [16])0x0;
              iVar31 = 0;
              iVar32 = 0;
              iVar33 = 0;
              iVar34 = 0;
              iVar91 = 0;
              iVar93 = 0;
              iVar94 = 0;
              iVar95 = 0;
              auVar105 = (undefined1  [16])0x0;
              iVar96 = 0;
              iVar106 = 0;
              iVar107 = 0;
              iVar108 = 0;
              iVar35 = 0;
              iVar48 = 0;
              iVar51 = 0;
              iVar52 = 0;
            }
            else {
              iVar35 = 0;
              iVar48 = 0;
              iVar51 = 0;
              iVar52 = 0;
              lVar10 = 0;
              iVar96 = 0;
              iVar106 = 0;
              iVar107 = 0;
              iVar108 = 0;
              iVar91 = 0;
              iVar93 = 0;
              iVar94 = 0;
              iVar95 = 0;
              iVar31 = 0;
              iVar32 = 0;
              iVar33 = 0;
              iVar34 = 0;
              iVar70 = 0;
              iVar87 = 0;
              iVar88 = 0;
              iVar89 = 0;
              auVar111 = (undefined1  [16])0x0;
              auVar138 = (undefined1  [16])0x0;
              auVar74 = (undefined1  [16])0x0;
              iVar9 = iVar23;
              do {
                auVar139 = *(undefined1 (*) [16])((long)pvVar12 + lVar10);
                auVar129._0_14_ = auVar139._0_14_;
                auVar129[0xe] = auVar139[7];
                auVar129[0xf] = -(auVar139[7] < '\0');
                auVar128._14_2_ = auVar129._14_2_;
                auVar128._0_13_ = auVar139._0_13_;
                auVar128[0xd] = -(auVar139[6] < '\0');
                auVar127._13_3_ = auVar128._13_3_;
                auVar127._0_12_ = auVar139._0_12_;
                auVar127[0xc] = auVar139[6];
                auVar126._12_4_ = auVar127._12_4_;
                auVar126._0_11_ = auVar139._0_11_;
                auVar126[0xb] = -(auVar139[5] < '\0');
                auVar125._11_5_ = auVar126._11_5_;
                auVar125._0_10_ = auVar139._0_10_;
                auVar125[10] = auVar139[5];
                auVar124._10_6_ = auVar125._10_6_;
                auVar124._0_9_ = auVar139._0_9_;
                auVar124[9] = -(auVar139[4] < '\0');
                auVar123._9_7_ = auVar124._9_7_;
                auVar123._0_8_ = auVar139._0_8_;
                auVar123[8] = auVar139[4];
                auVar122._8_8_ = auVar123._8_8_;
                auVar122[7] = -(auVar139[3] < '\0');
                auVar122[6] = auVar139[3];
                auVar122[5] = -(auVar139[2] < '\0');
                auVar122[4] = auVar139[2];
                auVar122[3] = -(auVar139[1] < '\0');
                auVar122[2] = auVar139[1];
                auVar122[1] = -(auVar139[0] < '\0');
                auVar122[0] = auVar139[0];
                auVar109[1] = -(auVar139[8] < '\0');
                auVar109[0] = auVar139[8];
                auVar109[2] = auVar139[9];
                auVar109[3] = -(auVar139[9] < '\0');
                auVar109[4] = auVar139[10];
                auVar109[5] = -(auVar139[10] < '\0');
                auVar109[6] = auVar139[0xb];
                auVar109[7] = -(auVar139[0xb] < '\0');
                auVar109[8] = auVar139[0xc];
                auVar109[9] = -(auVar139[0xc] < '\0');
                auVar109[10] = auVar139[0xd];
                auVar109[0xb] = -(auVar139[0xd] < '\0');
                auVar109[0xc] = auVar139[0xe];
                auVar109[0xd] = -(auVar139[0xe] < '\0');
                auVar109[0xe] = auVar139[0xf];
                auVar109[0xf] = -(auVar139[0xf] < '\0');
                auVar139 = *(undefined1 (*) [16])((long)pvVar11 + lVar10 * 2);
                auVar105 = *(undefined1 (*) [16])((long)pvVar11 + lVar10 * 2 + 0x10);
                auVar147._0_14_ = auVar139._0_14_;
                auVar147[0xe] = auVar139[7];
                auVar147[0xf] = -(auVar139[7] < '\0');
                auVar146._14_2_ = auVar147._14_2_;
                auVar146._0_13_ = auVar139._0_13_;
                auVar146[0xd] = -(auVar139[6] < '\0');
                auVar145._13_3_ = auVar146._13_3_;
                auVar145._0_12_ = auVar139._0_12_;
                auVar145[0xc] = auVar139[6];
                auVar144._12_4_ = auVar145._12_4_;
                auVar144._0_11_ = auVar139._0_11_;
                auVar144[0xb] = -(auVar139[5] < '\0');
                auVar143._11_5_ = auVar144._11_5_;
                auVar143._0_10_ = auVar139._0_10_;
                auVar143[10] = auVar139[5];
                auVar142._10_6_ = auVar143._10_6_;
                auVar142._0_9_ = auVar139._0_9_;
                auVar142[9] = -(auVar139[4] < '\0');
                auVar141._9_7_ = auVar142._9_7_;
                auVar141._0_8_ = auVar139._0_8_;
                auVar141[8] = auVar139[4];
                auVar140._8_8_ = auVar141._8_8_;
                auVar140[7] = -(auVar139[3] < '\0');
                auVar140[6] = auVar139[3];
                auVar140[5] = -(auVar139[2] < '\0');
                auVar140[4] = auVar139[2];
                auVar140[3] = -(auVar139[1] < '\0');
                auVar140[2] = auVar139[1];
                auVar140[1] = -(auVar139[0] < '\0');
                auVar140[0] = auVar139[0];
                auVar121[1] = -(auVar139[8] < '\0');
                auVar121[0] = auVar139[8];
                auVar121[2] = auVar139[9];
                auVar121[3] = -(auVar139[9] < '\0');
                auVar121[4] = auVar139[10];
                auVar121[5] = -(auVar139[10] < '\0');
                auVar121[6] = auVar139[0xb];
                auVar121[7] = -(auVar139[0xb] < '\0');
                auVar121[8] = auVar139[0xc];
                auVar121[9] = -(auVar139[0xc] < '\0');
                auVar121[10] = auVar139[0xd];
                auVar121[0xb] = -(auVar139[0xd] < '\0');
                auVar121[0xc] = auVar139[0xe];
                auVar121[0xd] = -(auVar139[0xe] < '\0');
                auVar121[0xe] = auVar139[0xf];
                auVar121[0xf] = -(auVar139[0xf] < '\0');
                auVar137._0_14_ = auVar105._0_14_;
                auVar137[0xe] = auVar105[7];
                auVar137[0xf] = -(auVar105[7] < '\0');
                auVar136._14_2_ = auVar137._14_2_;
                auVar136._0_13_ = auVar105._0_13_;
                auVar136[0xd] = -(auVar105[6] < '\0');
                auVar135._13_3_ = auVar136._13_3_;
                auVar135._0_12_ = auVar105._0_12_;
                auVar135[0xc] = auVar105[6];
                auVar134._12_4_ = auVar135._12_4_;
                auVar134._0_11_ = auVar105._0_11_;
                auVar134[0xb] = -(auVar105[5] < '\0');
                auVar133._11_5_ = auVar134._11_5_;
                auVar133._0_10_ = auVar105._0_10_;
                auVar133[10] = auVar105[5];
                auVar132._10_6_ = auVar133._10_6_;
                auVar132._0_9_ = auVar105._0_9_;
                auVar132[9] = -(auVar105[4] < '\0');
                auVar131._9_7_ = auVar132._9_7_;
                auVar131._0_8_ = auVar105._0_8_;
                auVar131[8] = auVar105[4];
                auVar130._8_8_ = auVar131._8_8_;
                auVar130[7] = -(auVar105[3] < '\0');
                auVar130[6] = auVar105[3];
                auVar130[5] = -(auVar105[2] < '\0');
                auVar130[4] = auVar105[2];
                auVar130[3] = -(auVar105[1] < '\0');
                auVar130[2] = auVar105[1];
                auVar130[1] = -(auVar105[0] < '\0');
                auVar130[0] = auVar105[0];
                auVar110[1] = -(auVar105[8] < '\0');
                auVar110[0] = auVar105[8];
                auVar110[2] = auVar105[9];
                auVar110[3] = -(auVar105[9] < '\0');
                auVar110[4] = auVar105[10];
                auVar110[5] = -(auVar105[10] < '\0');
                auVar110[6] = auVar105[0xb];
                auVar110[7] = -(auVar105[0xb] < '\0');
                auVar110[8] = auVar105[0xc];
                auVar110[9] = -(auVar105[0xc] < '\0');
                auVar110[10] = auVar105[0xd];
                auVar110[0xb] = -(auVar105[0xd] < '\0');
                auVar110[0xc] = auVar105[0xe];
                auVar110[0xd] = -(auVar105[0xe] < '\0');
                auVar110[0xe] = auVar105[0xf];
                auVar110[0xf] = -(auVar105[0xf] < '\0');
                auVar139 = pmaddwd(auVar122,auVar140);
                iVar35 = iVar35 + auVar139._0_4_;
                iVar48 = iVar48 + auVar139._4_4_;
                iVar51 = iVar51 + auVar139._8_4_;
                iVar52 = iVar52 + auVar139._12_4_;
                auVar139 = pmaddwd(auVar122,auVar121);
                iVar96 = iVar96 + auVar139._0_4_;
                iVar106 = iVar106 + auVar139._4_4_;
                iVar107 = iVar107 + auVar139._8_4_;
                iVar108 = iVar108 + auVar139._12_4_;
                auVar139 = pmaddwd(auVar122,auVar130);
                auVar105._0_4_ = auVar138._0_4_ + auVar139._0_4_;
                auVar105._4_4_ = auVar138._4_4_ + auVar139._4_4_;
                auVar105._8_4_ = auVar138._8_4_ + auVar139._8_4_;
                auVar105._12_4_ = auVar138._12_4_ + auVar139._12_4_;
                auVar139 = pmaddwd(auVar122,auVar110);
                iVar91 = iVar91 + auVar139._0_4_;
                iVar93 = iVar93 + auVar139._4_4_;
                iVar94 = iVar94 + auVar139._8_4_;
                iVar95 = iVar95 + auVar139._12_4_;
                auVar139 = pmaddwd(auVar140,auVar109);
                iVar31 = iVar31 + auVar139._0_4_;
                iVar32 = iVar32 + auVar139._4_4_;
                iVar33 = iVar33 + auVar139._8_4_;
                iVar34 = iVar34 + auVar139._12_4_;
                auVar139 = pmaddwd(auVar121,auVar109);
                auVar120._0_4_ = auVar74._0_4_ + auVar139._0_4_;
                auVar120._4_4_ = auVar74._4_4_ + auVar139._4_4_;
                auVar120._8_4_ = auVar74._8_4_ + auVar139._8_4_;
                auVar120._12_4_ = auVar74._12_4_ + auVar139._12_4_;
                auVar138 = pmaddwd(auVar130,auVar109);
                auVar139._0_4_ = auVar111._0_4_ + auVar138._0_4_;
                auVar139._4_4_ = auVar111._4_4_ + auVar138._4_4_;
                auVar139._8_4_ = auVar111._8_4_ + auVar138._8_4_;
                auVar139._12_4_ = auVar111._12_4_ + auVar138._12_4_;
                auVar111 = pmaddwd(auVar110,auVar109);
                iVar70 = iVar70 + auVar111._0_4_;
                iVar87 = iVar87 + auVar111._4_4_;
                iVar88 = iVar88 + auVar111._8_4_;
                iVar89 = iVar89 + auVar111._12_4_;
                lVar10 = lVar10 + 0x10;
                iVar9 = iVar9 + -1;
                auVar111 = auVar139;
                auVar138 = auVar105;
                auVar74 = auVar120;
              } while (iVar9 != 0);
            }
            *piVar29 = iVar52 + iVar51 + iVar48 + iVar35;
            *piVar18 = iVar108 + iVar107 + iVar106 + iVar96;
            *piVar24 = auVar105._12_4_ + auVar105._8_4_ + auVar105._4_4_ + auVar105._0_4_;
            *piVar20 = iVar95 + iVar94 + iVar93 + iVar91;
            piVar29[1] = iVar34 + iVar33 + iVar32 + iVar31;
            piVar18[1] = auVar120._12_4_ + auVar120._8_4_ + auVar120._4_4_ + auVar120._0_4_;
            piVar24[1] = auVar139._12_4_ + auVar139._8_4_ + auVar139._4_4_ + auVar139._0_4_;
            piVar20[1] = iVar89 + iVar88 + iVar87 + iVar70;
            piVar29 = piVar29 + 2;
            piVar18 = piVar18 + 2;
            piVar24 = piVar24 + 2;
            piVar20 = piVar20 + 2;
            uVar14 = uVar19 + 2;
            lVar10 = uVar19 + 3;
            pvVar12 = (void *)((long)pvVar12 + local_c8.cstep * local_c8.elemsize);
            uVar19 = uVar14;
          } while (lVar10 < (long)uVar13);
        }
        if ((int)uVar14 < (int)uVar1) {
          do {
            if ((int)(_h * iVar8) < 1) {
              iVar31 = 0;
              iVar32 = 0;
              iVar33 = 0;
              iVar34 = 0;
              auVar138 = (undefined1  [16])0x0;
              auVar111 = (undefined1  [16])0x0;
              iVar35 = 0;
              iVar48 = 0;
              iVar51 = 0;
              iVar52 = 0;
            }
            else {
              iVar35 = 0;
              iVar48 = 0;
              iVar51 = 0;
              iVar52 = 0;
              lVar10 = 0;
              iVar31 = 0;
              iVar32 = 0;
              iVar33 = 0;
              iVar34 = 0;
              pauVar30 = (undefined1 (*) [16])(local_68 * local_60 + (long)local_50);
              auVar139 = (undefined1  [16])0x0;
              auVar105 = (undefined1  [16])0x0;
              do {
                uVar19 = *(ulong *)((long)local_c8.data +
                                   lVar10 * 8 +
                                   (ulong)(((uint)uVar14 & 1) + ((uint)(uVar14 >> 1) & 0x7fffffff))
                                   * local_c8.cstep * local_c8.elemsize);
                auVar71[0] = (char)uVar19;
                cVar44 = (char)(uVar19 >> 8);
                cVar45 = (char)(uVar19 >> 0x10);
                cVar46 = (char)(uVar19 >> 0x18);
                cVar47 = (char)(uVar19 >> 0x20);
                cVar49 = (char)(uVar19 >> 0x28);
                cVar50 = (char)(uVar19 >> 0x30);
                auVar78._8_6_ = 0;
                auVar78._0_8_ = uVar19;
                auVar78[0xe] = (char)(uVar19 >> 0x38);
                auVar78[0xf] = -((long)uVar19 < 0);
                auVar77._14_2_ = auVar78._14_2_;
                auVar77._8_5_ = 0;
                auVar77._0_8_ = uVar19;
                auVar77[0xd] = -(cVar50 < '\0');
                auVar76._13_3_ = auVar77._13_3_;
                auVar76._8_4_ = 0;
                auVar76._0_8_ = uVar19;
                auVar76[0xc] = cVar50;
                auVar75._12_4_ = auVar76._12_4_;
                auVar75._8_3_ = 0;
                auVar75._0_8_ = uVar19;
                auVar75[0xb] = -(cVar49 < '\0');
                auVar74._11_5_ = auVar75._11_5_;
                auVar74._8_2_ = 0;
                auVar74._0_8_ = uVar19;
                auVar74[10] = cVar49;
                auVar73._10_6_ = auVar74._10_6_;
                auVar73[8] = 0;
                auVar73._0_8_ = uVar19;
                auVar73[9] = -(cVar47 < '\0');
                auVar72._9_7_ = auVar73._9_7_;
                auVar72[8] = cVar47;
                auVar72._0_8_ = uVar19;
                auVar71._8_8_ = auVar72._8_8_;
                auVar71[7] = -(cVar46 < '\0');
                auVar71[6] = cVar46;
                auVar71[5] = -(cVar45 < '\0');
                auVar71[4] = cVar45;
                auVar71[3] = -(cVar44 < '\0');
                auVar71[2] = cVar44;
                auVar71[1] = -(auVar71[0] < '\0');
                auVar120 = *pauVar30;
                auVar111 = pauVar30[1];
                auVar119._0_14_ = auVar120._0_14_;
                auVar119[0xe] = auVar120[7];
                auVar119[0xf] = -(auVar120[7] < '\0');
                auVar118._14_2_ = auVar119._14_2_;
                auVar118._0_13_ = auVar120._0_13_;
                auVar118[0xd] = -(auVar120[6] < '\0');
                auVar117._13_3_ = auVar118._13_3_;
                auVar117._0_12_ = auVar120._0_12_;
                auVar117[0xc] = auVar120[6];
                auVar116._12_4_ = auVar117._12_4_;
                auVar116._0_11_ = auVar120._0_11_;
                auVar116[0xb] = -(auVar120[5] < '\0');
                auVar115._11_5_ = auVar116._11_5_;
                auVar115._0_10_ = auVar120._0_10_;
                auVar115[10] = auVar120[5];
                auVar114._10_6_ = auVar115._10_6_;
                auVar114._0_9_ = auVar120._0_9_;
                auVar114[9] = -(auVar120[4] < '\0');
                auVar113._9_7_ = auVar114._9_7_;
                auVar113._0_8_ = auVar120._0_8_;
                auVar113[8] = auVar120[4];
                auVar112._8_8_ = auVar113._8_8_;
                auVar112[7] = -(auVar120[3] < '\0');
                auVar112[6] = auVar120[3];
                auVar112[5] = -(auVar120[2] < '\0');
                auVar112[4] = auVar120[2];
                auVar112[3] = -(auVar120[1] < '\0');
                auVar112[2] = auVar120[1];
                auVar112[1] = -(auVar120[0] < '\0');
                auVar112[0] = auVar120[0];
                auVar90[1] = -(auVar120[8] < '\0');
                auVar90[0] = auVar120[8];
                auVar90[2] = auVar120[9];
                auVar90[3] = -(auVar120[9] < '\0');
                auVar90[4] = auVar120[10];
                auVar90[5] = -(auVar120[10] < '\0');
                auVar90[6] = auVar120[0xb];
                auVar90[7] = -(auVar120[0xb] < '\0');
                auVar90[8] = auVar120[0xc];
                auVar90[9] = -(auVar120[0xc] < '\0');
                auVar90[10] = auVar120[0xd];
                auVar90[0xb] = -(auVar120[0xd] < '\0');
                auVar90[0xc] = auVar120[0xe];
                auVar90[0xd] = -(auVar120[0xe] < '\0');
                auVar90[0xe] = auVar120[0xf];
                auVar90[0xf] = -(auVar120[0xf] < '\0');
                auVar104._0_14_ = auVar111._0_14_;
                auVar104[0xe] = auVar111[7];
                auVar104[0xf] = -(auVar111[7] < '\0');
                auVar103._14_2_ = auVar104._14_2_;
                auVar103._0_13_ = auVar111._0_13_;
                auVar103[0xd] = -(auVar111[6] < '\0');
                auVar102._13_3_ = auVar103._13_3_;
                auVar102._0_12_ = auVar111._0_12_;
                auVar102[0xc] = auVar111[6];
                auVar101._12_4_ = auVar102._12_4_;
                auVar101._0_11_ = auVar111._0_11_;
                auVar101[0xb] = -(auVar111[5] < '\0');
                auVar100._11_5_ = auVar101._11_5_;
                auVar100._0_10_ = auVar111._0_10_;
                auVar100[10] = auVar111[5];
                auVar99._10_6_ = auVar100._10_6_;
                auVar99._0_9_ = auVar111._0_9_;
                auVar99[9] = -(auVar111[4] < '\0');
                auVar98._9_7_ = auVar99._9_7_;
                auVar98._0_8_ = auVar111._0_8_;
                auVar98[8] = auVar111[4];
                auVar97._8_8_ = auVar98._8_8_;
                auVar97[7] = -(auVar111[3] < '\0');
                auVar97[6] = auVar111[3];
                auVar97[5] = -(auVar111[2] < '\0');
                auVar97[4] = auVar111[2];
                auVar97[3] = -(auVar111[1] < '\0');
                auVar97[2] = auVar111[1];
                auVar97[1] = -(auVar111[0] < '\0');
                auVar97[0] = auVar111[0];
                auVar92[1] = -(auVar111[8] < '\0');
                auVar92[0] = auVar111[8];
                auVar92[2] = auVar111[9];
                auVar92[3] = -(auVar111[9] < '\0');
                auVar92[4] = auVar111[10];
                auVar92[5] = -(auVar111[10] < '\0');
                auVar92[6] = auVar111[0xb];
                auVar92[7] = -(auVar111[0xb] < '\0');
                auVar92[8] = auVar111[0xc];
                auVar92[9] = -(auVar111[0xc] < '\0');
                auVar92[10] = auVar111[0xd];
                auVar92[0xb] = -(auVar111[0xd] < '\0');
                auVar92[0xc] = auVar111[0xe];
                auVar92[0xd] = -(auVar111[0xe] < '\0');
                auVar92[0xe] = auVar111[0xf];
                auVar92[0xf] = -(auVar111[0xf] < '\0');
                auVar120 = pmaddwd(auVar112,auVar71);
                iVar31 = iVar31 + auVar120._0_4_;
                iVar32 = iVar32 + auVar120._4_4_;
                iVar33 = iVar33 + auVar120._8_4_;
                iVar34 = iVar34 + auVar120._12_4_;
                auVar120 = pmaddwd(auVar90,auVar71);
                auVar138._0_4_ = auVar105._0_4_ + auVar120._0_4_;
                auVar138._4_4_ = auVar105._4_4_ + auVar120._4_4_;
                auVar138._8_4_ = auVar105._8_4_ + auVar120._8_4_;
                auVar138._12_4_ = auVar105._12_4_ + auVar120._12_4_;
                auVar105 = pmaddwd(auVar97,auVar71);
                auVar111._0_4_ = auVar139._0_4_ + auVar105._0_4_;
                auVar111._4_4_ = auVar139._4_4_ + auVar105._4_4_;
                auVar111._8_4_ = auVar139._8_4_ + auVar105._8_4_;
                auVar111._12_4_ = auVar139._12_4_ + auVar105._12_4_;
                auVar139 = pmaddwd(auVar92,auVar71);
                iVar35 = iVar35 + auVar139._0_4_;
                iVar48 = iVar48 + auVar139._4_4_;
                iVar51 = iVar51 + auVar139._8_4_;
                iVar52 = iVar52 + auVar139._12_4_;
                pauVar30 = pauVar30 + 2;
                lVar10 = lVar10 + 1;
                auVar139 = auVar111;
                auVar105 = auVar138;
              } while (iVar23 != (int)lVar10);
            }
            *piVar29 = iVar34 + iVar33 + iVar32 + iVar31;
            *piVar18 = auVar138._12_4_ + auVar138._8_4_ + auVar138._4_4_ + auVar138._0_4_;
            *piVar24 = auVar111._12_4_ + auVar111._8_4_ + auVar111._4_4_ + auVar111._0_4_;
            *piVar20 = iVar52 + iVar51 + iVar48 + iVar35;
            piVar29 = piVar29 + 1;
            piVar18 = piVar18 + 1;
            piVar24 = piVar24 + 1;
            piVar20 = piVar20 + 1;
            uVar15 = (uint)uVar14 + 1;
            uVar14 = (ulong)uVar15;
          } while (uVar15 != uVar1);
        }
        pvVar11 = (void *)((long)pvVar11 + local_68);
        uVar14 = local_60 + 1;
      } while (local_60 + 1 != local_48);
    }
    uVar14 = (long)iVar2 & 0xfffffffffffffffc;
    if ((int)uVar14 != iVar2) {
      sVar3 = local_70->cstep;
      sVar4 = local_70->elemsize;
      pvVar11 = local_70->data;
      lVar10 = kernel->cstep * kernel->elemsize;
      pvVar12 = kernel->data;
      iVar23 = _h * iVar8;
      do {
        piVar18 = (int *)(sVar3 * sVar4 * uVar14 + (long)pvVar11);
        uVar15 = (uint)uVar14;
        if ((int)uVar1 < 2) {
          uVar19 = 0;
        }
        else {
          uVar27 = uVar15 + 3;
          if (-1 < (int)uVar15) {
            uVar27 = uVar15;
          }
          uVar25 = 0;
          do {
            if (iVar23 < 1) {
              iVar35 = 0;
              iVar48 = 0;
              iVar51 = 0;
              iVar52 = 0;
              iVar31 = 0;
              iVar32 = 0;
              iVar33 = 0;
              iVar34 = 0;
            }
            else {
              pauVar30 = (undefined1 (*) [16])
                         ((uVar25 >> 1) * local_c8.cstep * local_c8.elemsize + (long)local_c8.data);
              iVar31 = 0;
              iVar32 = 0;
              iVar33 = 0;
              iVar34 = 0;
              lVar26 = 0;
              iVar35 = 0;
              iVar48 = 0;
              iVar51 = 0;
              iVar52 = 0;
              do {
                auVar139 = *pauVar30;
                auVar86._0_14_ = auVar139._0_14_;
                auVar86[0xe] = auVar139[7];
                auVar86[0xf] = -(auVar139[7] < '\0');
                auVar85._14_2_ = auVar86._14_2_;
                auVar85._0_13_ = auVar139._0_13_;
                auVar85[0xd] = -(auVar139[6] < '\0');
                auVar84._13_3_ = auVar85._13_3_;
                auVar84._0_12_ = auVar139._0_12_;
                auVar84[0xc] = auVar139[6];
                auVar83._12_4_ = auVar84._12_4_;
                auVar83._0_11_ = auVar139._0_11_;
                auVar83[0xb] = -(auVar139[5] < '\0');
                auVar82._11_5_ = auVar83._11_5_;
                auVar82._0_10_ = auVar139._0_10_;
                auVar82[10] = auVar139[5];
                auVar81._10_6_ = auVar82._10_6_;
                auVar81._0_9_ = auVar139._0_9_;
                auVar81[9] = -(auVar139[4] < '\0');
                auVar80._9_7_ = auVar81._9_7_;
                auVar80._0_8_ = auVar139._0_8_;
                auVar80[8] = auVar139[4];
                auVar79._8_8_ = auVar80._8_8_;
                auVar79[7] = -(auVar139[3] < '\0');
                auVar79[6] = auVar139[3];
                auVar79[5] = -(auVar139[2] < '\0');
                auVar79[4] = auVar139[2];
                auVar79[3] = -(auVar139[1] < '\0');
                auVar79[2] = auVar139[1];
                auVar79[1] = -(auVar139[0] < '\0');
                auVar79[0] = auVar139[0];
                auVar53[1] = -(auVar139[8] < '\0');
                auVar53[0] = auVar139[8];
                auVar53[2] = auVar139[9];
                auVar53[3] = -(auVar139[9] < '\0');
                auVar53[4] = auVar139[10];
                auVar53[5] = -(auVar139[10] < '\0');
                auVar53[6] = auVar139[0xb];
                auVar53[7] = -(auVar139[0xb] < '\0');
                auVar53[8] = auVar139[0xc];
                auVar53[9] = -(auVar139[0xc] < '\0');
                auVar53[10] = auVar139[0xd];
                auVar53[0xb] = -(auVar139[0xd] < '\0');
                auVar53[0xc] = auVar139[0xe];
                auVar53[0xd] = -(auVar139[0xe] < '\0');
                auVar53[0xe] = auVar139[0xf];
                auVar53[0xf] = -(auVar139[0xf] < '\0');
                uVar19 = *(ulong *)((long)pvVar12 +
                                   lVar26 * 8 +
                                   (int)(((int)uVar27 >> 2) + (uVar15 - (uVar27 & 0xfffffffc))) *
                                   lVar10);
                auVar62[0] = (char)uVar19;
                cVar44 = (char)(uVar19 >> 8);
                cVar45 = (char)(uVar19 >> 0x10);
                cVar46 = (char)(uVar19 >> 0x18);
                cVar47 = (char)(uVar19 >> 0x20);
                cVar49 = (char)(uVar19 >> 0x28);
                cVar50 = (char)(uVar19 >> 0x30);
                auVar69._8_6_ = 0;
                auVar69._0_8_ = uVar19;
                auVar69[0xe] = (char)(uVar19 >> 0x38);
                auVar69[0xf] = -((long)uVar19 < 0);
                auVar68._14_2_ = auVar69._14_2_;
                auVar68._8_5_ = 0;
                auVar68._0_8_ = uVar19;
                auVar68[0xd] = -(cVar50 < '\0');
                auVar67._13_3_ = auVar68._13_3_;
                auVar67._8_4_ = 0;
                auVar67._0_8_ = uVar19;
                auVar67[0xc] = cVar50;
                auVar66._12_4_ = auVar67._12_4_;
                auVar66._8_3_ = 0;
                auVar66._0_8_ = uVar19;
                auVar66[0xb] = -(cVar49 < '\0');
                auVar65._11_5_ = auVar66._11_5_;
                auVar65._8_2_ = 0;
                auVar65._0_8_ = uVar19;
                auVar65[10] = cVar49;
                auVar64._10_6_ = auVar65._10_6_;
                auVar64[8] = 0;
                auVar64._0_8_ = uVar19;
                auVar64[9] = -(cVar47 < '\0');
                auVar63._9_7_ = auVar64._9_7_;
                auVar63[8] = cVar47;
                auVar63._0_8_ = uVar19;
                auVar62._8_8_ = auVar63._8_8_;
                auVar62[7] = -(cVar46 < '\0');
                auVar62[6] = cVar46;
                auVar62[5] = -(cVar45 < '\0');
                auVar62[4] = cVar45;
                auVar62[3] = -(cVar44 < '\0');
                auVar62[2] = cVar44;
                auVar62[1] = -(auVar62[0] < '\0');
                auVar139 = pmaddwd(auVar79,auVar62);
                iVar35 = iVar35 + auVar139._0_4_;
                iVar48 = iVar48 + auVar139._4_4_;
                iVar51 = iVar51 + auVar139._8_4_;
                iVar52 = iVar52 + auVar139._12_4_;
                auVar139 = pmaddwd(auVar62,auVar53);
                iVar31 = iVar31 + auVar139._0_4_;
                iVar32 = iVar32 + auVar139._4_4_;
                iVar33 = iVar33 + auVar139._8_4_;
                iVar34 = iVar34 + auVar139._12_4_;
                pauVar30 = pauVar30 + 1;
                lVar26 = lVar26 + 1;
              } while (iVar23 != (int)lVar26);
            }
            *(ulong *)piVar18 =
                 CONCAT44(iVar33 + iVar31 + iVar34 + iVar32,iVar51 + iVar35 + iVar52 + iVar48);
            piVar18 = piVar18 + 2;
            uVar19 = uVar25 + 2;
            lVar26 = uVar25 + 3;
            uVar25 = uVar19;
          } while (lVar26 < (long)uVar13);
        }
        if ((int)uVar19 < (int)uVar1) {
          uVar27 = uVar15 + 3;
          if (-1 < (int)uVar15) {
            uVar27 = uVar15;
          }
          do {
            if ((int)(_h * iVar8) < 1) {
              iVar31 = 0;
              iVar32 = 0;
              iVar33 = 0;
              iVar34 = 0;
            }
            else {
              iVar31 = 0;
              iVar32 = 0;
              iVar33 = 0;
              iVar34 = 0;
              lVar26 = 0;
              do {
                uVar25 = *(ulong *)((long)local_c8.data +
                                   lVar26 * 8 +
                                   (ulong)(((uint)uVar19 & 1) + ((uint)(uVar19 >> 1) & 0x7fffffff))
                                   * local_c8.cstep * local_c8.elemsize);
                auVar36[0] = (char)uVar25;
                cVar44 = (char)(uVar25 >> 8);
                cVar45 = (char)(uVar25 >> 0x10);
                cVar46 = (char)(uVar25 >> 0x18);
                cVar47 = (char)(uVar25 >> 0x20);
                cVar49 = (char)(uVar25 >> 0x28);
                cVar50 = (char)(uVar25 >> 0x30);
                auVar43._8_6_ = 0;
                auVar43._0_8_ = uVar25;
                auVar43[0xe] = (char)(uVar25 >> 0x38);
                auVar43[0xf] = -((long)uVar25 < 0);
                auVar42._14_2_ = auVar43._14_2_;
                auVar42._8_5_ = 0;
                auVar42._0_8_ = uVar25;
                auVar42[0xd] = -(cVar50 < '\0');
                auVar41._13_3_ = auVar42._13_3_;
                auVar41._8_4_ = 0;
                auVar41._0_8_ = uVar25;
                auVar41[0xc] = cVar50;
                auVar40._12_4_ = auVar41._12_4_;
                auVar40._8_3_ = 0;
                auVar40._0_8_ = uVar25;
                auVar40[0xb] = -(cVar49 < '\0');
                auVar39._11_5_ = auVar40._11_5_;
                auVar39._8_2_ = 0;
                auVar39._0_8_ = uVar25;
                auVar39[10] = cVar49;
                auVar38._10_6_ = auVar39._10_6_;
                auVar38[8] = 0;
                auVar38._0_8_ = uVar25;
                auVar38[9] = -(cVar47 < '\0');
                auVar37._9_7_ = auVar38._9_7_;
                auVar37[8] = cVar47;
                auVar37._0_8_ = uVar25;
                auVar36._8_8_ = auVar37._8_8_;
                auVar36[7] = -(cVar46 < '\0');
                auVar36[6] = cVar46;
                auVar36[5] = -(cVar45 < '\0');
                auVar36[4] = cVar45;
                auVar36[3] = -(cVar44 < '\0');
                auVar36[2] = cVar44;
                auVar36[1] = -(auVar36[0] < '\0');
                uVar25 = *(ulong *)((long)pvVar12 +
                                   lVar26 * 8 +
                                   (int)(((int)uVar27 >> 2) + (uVar15 - (uVar27 & 0xfffffffc))) *
                                   lVar10);
                auVar54[0] = (char)uVar25;
                cVar44 = (char)(uVar25 >> 8);
                cVar45 = (char)(uVar25 >> 0x10);
                cVar46 = (char)(uVar25 >> 0x18);
                cVar47 = (char)(uVar25 >> 0x20);
                cVar49 = (char)(uVar25 >> 0x28);
                cVar50 = (char)(uVar25 >> 0x30);
                auVar61._8_6_ = 0;
                auVar61._0_8_ = uVar25;
                auVar61[0xe] = (char)(uVar25 >> 0x38);
                auVar61[0xf] = -((long)uVar25 < 0);
                auVar60._14_2_ = auVar61._14_2_;
                auVar60._8_5_ = 0;
                auVar60._0_8_ = uVar25;
                auVar60[0xd] = -(cVar50 < '\0');
                auVar59._13_3_ = auVar60._13_3_;
                auVar59._8_4_ = 0;
                auVar59._0_8_ = uVar25;
                auVar59[0xc] = cVar50;
                auVar58._12_4_ = auVar59._12_4_;
                auVar58._8_3_ = 0;
                auVar58._0_8_ = uVar25;
                auVar58[0xb] = -(cVar49 < '\0');
                auVar57._11_5_ = auVar58._11_5_;
                auVar57._8_2_ = 0;
                auVar57._0_8_ = uVar25;
                auVar57[10] = cVar49;
                auVar56._10_6_ = auVar57._10_6_;
                auVar56[8] = 0;
                auVar56._0_8_ = uVar25;
                auVar56[9] = -(cVar47 < '\0');
                auVar55._9_7_ = auVar56._9_7_;
                auVar55[8] = cVar47;
                auVar55._0_8_ = uVar25;
                auVar54._8_8_ = auVar55._8_8_;
                auVar54[7] = -(cVar46 < '\0');
                auVar54[6] = cVar46;
                auVar54[5] = -(cVar45 < '\0');
                auVar54[4] = cVar45;
                auVar54[3] = -(cVar44 < '\0');
                auVar54[2] = cVar44;
                auVar54[1] = -(auVar54[0] < '\0');
                auVar139 = pmaddwd(auVar54,auVar36);
                iVar31 = iVar31 + auVar139._0_4_;
                iVar32 = iVar32 + auVar139._4_4_;
                iVar33 = iVar33 + auVar139._8_4_;
                iVar34 = iVar34 + auVar139._12_4_;
                lVar26 = lVar26 + 1;
              } while (iVar23 != (int)lVar26);
            }
            *piVar18 = iVar34 + iVar32 + iVar33 + iVar31;
            piVar18 = piVar18 + 1;
            uVar28 = (uint)uVar19 + 1;
            uVar19 = (ulong)uVar28;
          } while (uVar28 != uVar1);
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < (long)iVar2);
    }
    piVar18 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        local_78 = kernel;
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_pack8to1_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_pack8to1_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to1_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to1_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_madd_epi16(_val23_16, _w01_16));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_madd_epi16(_val32_16, _w01_16));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_madd_epi16(_val23_16, _w23_16));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_madd_epi16(_val32_16, _w23_16));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            int sum[16];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
            _mm256_storeu_si256((__m256i*)(sum + 8), _sum04_15);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0[2] = sum[8];
            outptr1[2] = sum[9];
            outptr2[2] = sum[10];
            outptr3[2] = sum[11];
            outptr0[3] = sum[12];
            outptr1[3] = sum[13];
            outptr2[3] = sum[14];
            outptr3[3] = sum[15];
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                _sum02 = _mm_add_epi32(_mm_madd_epi16(_val0, _w2), _sum02);
                _sum03 = _mm_add_epi32(_mm_madd_epi16(_val0, _w3), _sum03);
                _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
                _sum12 = _mm_add_epi32(_mm_madd_epi16(_val1, _w2), _sum12);
                _sum13 = _mm_add_epi32(_mm_madd_epi16(_val1, _w3), _sum13);
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            int sum[8];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);
#endif

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_madd_epi16(_valval, _w01_16));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_madd_epi16(_valval, _w23_16));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val, _w1), _sum1);
                _sum2 = _mm_add_epi32(_mm_madd_epi16(_val, _w2), _sum2);
                _sum3 = _mm_add_epi32(_mm_madd_epi16(_val, _w3), _sum3);
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum01 = _mm256_setzero_si256();
            __m256i _sum23 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

#if __AVXVNNI__ || __AVX512VNNI__
                _sum01 = _mm256_dpwssd_epi32(_sum01, _val01_16, _w01_16);
                _sum23 = _mm256_dpwssd_epi32(_sum23, _val23_16, _w01_16);
#else
                _sum01 = _mm256_add_epi32(_sum01, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum23 = _mm256_add_epi32(_sum23, _mm256_madd_epi16(_val23_16, _w01_16));
#endif

                tmpptr += 32;
                kptr0 += 8;
            }

            __m128i _sum0 = _mm256_extracti128_si256(_sum01, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum01, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum23, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum23, 1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum1);
            outptr0[2] = _mm_reduce_add_epi32(_sum2);
            outptr0[3] = _mm_reduce_add_epi32(_sum3);
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum01 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

#if __AVXVNNI__ || __AVX512VNNI__
                _sum01 = _mm256_dpwssd_epi32(_sum01, _val01_16, _w01_16);
#else
                _sum01 = _mm256_add_epi32(_sum01, _mm256_madd_epi16(_val01_16, _w01_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val0, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val1, _w0, _sum1);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum1);
#endif
#endif

                tmpptr += 16;
                kptr0 += 8;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum01, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum01, 1);
#endif

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum1);
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val0, _w0, _sum0);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum0);
#endif

                tmpptr += 8;
                kptr0 += 8;
            }

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0 += 1;
        }
    }
}